

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_OnStreamEnd(FAudioVoiceCallback *callback)

{
  long lVar1;
  FACTWaveCallback *c;
  FAudioVoiceCallback *callback_local;
  
  *(undefined4 *)(callback[1].OnBufferEnd + 0x20) = 0x20;
  if ((*(long *)(callback[1].OnBufferEnd + 8) != 0) &&
     (*(OnBufferEndFunc *)(*(long *)(callback[1].OnBufferEnd + 8) + 0x40) == callback[1].OnBufferEnd
     )) {
    *(uint *)(*(long *)(callback[1].OnBufferEnd + 8) + 0x3c) =
         *(uint *)(*(long *)(callback[1].OnBufferEnd + 8) + 0x3c) | 0x20;
    *(uint *)(*(long *)(callback[1].OnBufferEnd + 8) + 0x3c) =
         *(uint *)(*(long *)(callback[1].OnBufferEnd + 8) + 0x3c) & 0xffffffe7;
    lVar1 = *(long *)(*(long *)(callback[1].OnBufferEnd + 8) + 0x20);
    *(char *)(lVar1 + 0x13) = *(char *)(lVar1 + 0x13) + -1;
  }
  return;
}

Assistant:

void FACT_INTERNAL_OnStreamEnd(FAudioVoiceCallback *callback)
{
	FACTWaveCallback *c = (FACTWaveCallback*) callback;

	c->wave->state = FACT_STATE_STOPPED;

	if (	c->wave->parentCue != NULL &&
		c->wave->parentCue->simpleWave == c->wave	)
	{
		c->wave->parentCue->state |= FACT_STATE_STOPPED;
		c->wave->parentCue->state &= ~(
			FACT_STATE_PLAYING |
			FACT_STATE_STOPPING
		);
		c->wave->parentCue->data->instanceCount -= 1;
	}
}